

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O1

void __thiscall Js::JavascriptExceptionObject::FillStackBackTrace(JavascriptExceptionObject *this)

{
  ScriptContext *pSVar1;
  Recycler *alloc;
  StackBackTrace *pSVar2;
  Type *addr;
  AutoNestedHandledExceptionType local_1c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (((this->stackBackTrace).ptr == (StackBackTrace *)0x0) &&
     (pSVar1 = (this->scriptContext).ptr, pSVar1 != (ScriptContext *)0x0)) {
    alloc = pSVar1->threadContext->recycler;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_1c,ExceptionType_OutOfMemory);
    pSVar2 = StackBackTrace::Capture<Memory::Recycler>(alloc,2,0x1e);
    addr = &this->stackBackTrace;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pSVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_1c);
  }
  return;
}

Assistant:

void JavascriptExceptionObject::FillStackBackTrace()
    {
        // Note: this->scriptContext can be NULL when we throw Out Of Memory exception.
        if (this->stackBackTrace == NULL && this->scriptContext != NULL)
        {
            Recycler* recycler = scriptContext->GetThreadContext()->GetRecycler();
            HRESULT hr = NOERROR;
            BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
            {
                this->stackBackTrace = StackBackTrace::Capture(recycler, JavascriptExceptionObject::StackToSkip, JavascriptExceptionObject::StackTraceDepth);
            }
            END_TRANSLATE_OOM_TO_HRESULT(hr)
        }
    }